

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void mazexy(level *lev,coord *cc)

{
  int iVar1;
  bool bVar2;
  int local_24;
  int local_20;
  int y;
  int x;
  int cpt;
  coord *cc_local;
  level *lev_local;
  
  y = 0;
  do {
    iVar1 = rn2((x_maze_max >> 1) + -1);
    cc->x = (char)(iVar1 << 1) + '\x03';
    iVar1 = rn2((y_maze_max >> 1) + -1);
    cc->y = (char)(iVar1 << 1) + '\x03';
    y = y + 1;
    bVar2 = false;
    if (y < 100) {
      bVar2 = lev->locations[cc->x][cc->y].typ != '\x19';
    }
  } while (bVar2);
  if (99 < y) {
    local_20 = 0;
    do {
      if ((x_maze_max >> 1) + -1 <= local_20) {
        panic("mazexy: can\'t find a place!");
      }
      for (local_24 = 0; local_24 < (y_maze_max >> 1) + -1; local_24 = local_24 + 1) {
        cc->x = (char)(local_20 << 1) + '\x03';
        cc->y = (char)(local_24 << 1) + '\x03';
        if (lev->locations[cc->x][cc->y].typ == '\x19') {
          return;
        }
      }
      local_20 = local_20 + 1;
    } while( true );
  }
  return;
}

Assistant:

void mazexy(struct level *lev, coord *cc)
{
	int cpt=0;

	do {
	    cc->x = 3 + 2*rn2((x_maze_max>>1) - 1);
	    cc->y = 3 + 2*rn2((y_maze_max>>1) - 1);
	    cpt++;
	} while (cpt < 100 && lev->locations[cc->x][cc->y].typ != ROOM);
	if (cpt >= 100) {
		int x, y;
		/* last try */
		for (x = 0; x < (x_maze_max>>1) - 1; x++)
		    for (y = 0; y < (y_maze_max>>1) - 1; y++) {
			cc->x = 3 + 2 * x;
			cc->y = 3 + 2 * y;
			if (lev->locations[cc->x][cc->y].typ == ROOM)
			    return;
		    }
		panic("mazexy: can't find a place!");
	}
	return;
}